

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_window_t window;
  ZSTD_CCtx_params params;
  uint uVar1;
  U32 UVar2;
  ZSTD_CCtx *pZVar3;
  ZSTD_CCtx *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  int *in_RDI;
  void *in_R8;
  int in_R9D;
  ZSTD_customMem in_stack_00000000;
  size_t cSize;
  U32 correction;
  U32 cycleLog;
  size_t fhSize;
  ZSTD_matchState_t *ms;
  U32 reducerValue;
  undefined8 in_stack_ffffffffffffff90;
  U32 lastFrameChunk_00;
  int *in_stack_ffffffffffffff98;
  undefined1 *in_stack_ffffffffffffffa0;
  undefined1 *puVar4;
  size_t in_stack_ffffffffffffffa8;
  U32 in_stack_ffffffffffffffb0;
  U32 in_stack_ffffffffffffffb4;
  ZSTD_CCtx *cctx_00;
  ZSTD_window_t *window_00;
  uint in_stack_ffffffffffffffc8;
  undefined8 in_stack_fffffffffffffff8;
  
  lastFrameChunk_00 = (U32)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  puVar4 = &stack0xffffffffffffff18;
  window_00 = (ZSTD_window_t *)(in_RDI + 0x9a);
  cctx_00 = (ZSTD_CCtx *)0x0;
  if (*in_RDI == 0) {
    pZVar3 = (ZSTD_CCtx *)0xffffffffffffffc4;
  }
  else {
    if ((in_R9D != 0) && (*in_RDI == 1)) {
      in_stack_ffffffffffffff98 = in_RDI + 0x22;
      params.cParams._4_8_ = in_stack_ffffffffffffffa8;
      params._0_8_ = &stack0xffffffffffffff18;
      params.cParams.searchLog = in_stack_ffffffffffffffb0;
      params.cParams.searchLength = in_stack_ffffffffffffffb4;
      params.cParams.targetLength = 0;
      params.cParams.strategy = 0;
      params.fParams._0_8_ = window_00;
      params.fParams.noDictIDFlag = in_stack_ffffffffffffffc8;
      params.compressionLevel = in_R9D;
      params._48_8_ = in_R8;
      params._56_8_ = in_RCX;
      params._64_8_ = in_RDX;
      params.ldmParams._4_8_ = in_RSI;
      params.ldmParams._12_8_ = in_RDI;
      params._88_8_ = in_stack_fffffffffffffff8;
      params.customMem = in_stack_00000000;
      cctx_00 = (ZSTD_CCtx *)
                ZSTD_writeFrameHeader
                          (*(void **)(in_RDI + 0x3e),*(size_t *)(in_RDI + 0x3c),params,
                           *(U64 *)(in_RDI + 0x3a),
                           (U32)((ulong)*(undefined8 *)(in_RDI + 0x38) >> 0x20));
      uVar1 = ZSTD_isError(0x1f4b53);
      if (uVar1 != 0) {
        return (size_t)cctx_00;
      }
      *in_RDI = 2;
      in_stack_ffffffffffffffa0 = puVar4;
    }
    pZVar3 = cctx_00;
    if (in_R8 != (void *)0x0) {
      UVar2 = ZSTD_window_update(window_00,in_RCX,(size_t)in_R8);
      if (UVar2 == 0) {
        *(U32 *)((long)&window_00[1].nextSrc + 4) = window_00->dictLimit;
      }
      reducerValue = (U32)((ulong)window_00->dictBase >> 0x20);
      pZVar3 = *(ZSTD_CCtx **)&window_00->dictLimit;
      window.dictBase._4_4_ = reducerValue;
      window._0_20_ = *(undefined1 (*) [20])window_00;
      window._24_8_ = pZVar3;
      UVar2 = ZSTD_window_needOverflowCorrection
                        (window,(void *)((long)&in_RCX->stage + (long)in_R8));
      if (UVar2 != 0) {
        in_stack_ffffffffffffffb4 = ZSTD_cycleLog(in_RDI[0x24],in_RDI[0x29]);
        in_stack_ffffffffffffffb0 =
             ZSTD_window_correctOverflow
                       (window_00,in_stack_ffffffffffffffb4,window_00->lowLimit,in_RCX);
        ZSTD_reduceIndex(pZVar3,reducerValue);
        if (*(uint *)((long)&window_00[1].nextSrc + 4) < in_stack_ffffffffffffffb0) {
          *(undefined4 *)((long)&window_00[1].nextSrc + 4) = 0;
        }
        else {
          *(U32 *)((long)&window_00[1].nextSrc + 4) =
               *(int *)((long)&window_00[1].nextSrc + 4) - in_stack_ffffffffffffffb0;
        }
        *(undefined4 *)&window_00[1].nextSrc = 0;
      }
      if (in_RDI[0x33] != 0) {
        ZSTD_window_update((ZSTD_window_t *)(in_RDI + 0x7c),in_RCX,(size_t)in_R8);
      }
      if (in_R9D == 0) {
        pZVar3 = (ZSTD_CCtx *)
                 ZSTD_compressBlock_internal
                           (in_RCX,in_R8,(ulong)in_stack_ffffffffffffffc8,window_00,(size_t)cctx_00)
        ;
      }
      else {
        pZVar3 = (ZSTD_CCtx *)
                 ZSTD_compress_frameChunk
                           (cctx_00,(void *)CONCAT44(in_stack_ffffffffffffffb4,
                                                     in_stack_ffffffffffffffb0),
                            in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                            (size_t)in_stack_ffffffffffffff98,lastFrameChunk_00);
      }
      uVar1 = ZSTD_isError(0x1f4dca);
      if (uVar1 == 0) {
        *(long *)(in_RDI + 0x4a) = (long)in_R8 + *(long *)(in_RDI + 0x4a);
        *(long *)(in_RDI + 0x4c) =
             (long)&cctx_00->stage + *(long *)(in_RDI + 0x4c) + (long)&pZVar3->stage;
        if ((*(long *)(in_RDI + 0x48) == 0) ||
           (*(long *)(in_RDI + 0x4a) + 1U <= *(ulong *)(in_RDI + 0x48))) {
          pZVar3 = (ZSTD_CCtx *)((long)&cctx_00->stage + (long)&pZVar3->stage);
        }
        else {
          pZVar3 = (ZSTD_CCtx *)0xffffffffffffffb8;
        }
      }
    }
  }
  return (size_t)pZVar3;
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (U32)srcSize);
    if (cctx->stage==ZSTDcs_created) return ERROR(stage_wrong);   /* missing init (ZSTD_compressBegin) */

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        if (ZSTD_isError(fhSize)) return fhSize;
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize)) {
        ms->nextToUpdate = ms->window.dictLimit;
    }

    // Added this: Fixes a crash after 4 GB of input data -cat
    if (ZSTD_window_needOverflowCorrection(ms->window, (char*)src + srcSize)) {
        U32 const cycleLog = ZSTD_cycleLog(cctx->appliedParams.cParams.chainLog, cctx->appliedParams.cParams.strategy);
        U32 const correction = ZSTD_window_correctOverflow(&ms->window, cycleLog, ms->window.lowLimit, (char*)src);
        ZSTD_STATIC_ASSERT(ZSTD_CHAINLOG_MAX <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX_32 <= 30);
        ZSTD_STATIC_ASSERT(ZSTD_WINDOWLOG_MAX <= 31);

        ZSTD_reduceIndex(cctx, correction);
        if (ms->nextToUpdate < correction) ms->nextToUpdate = 0;
        else ms->nextToUpdate -= correction;
        ms->loadedDictEnd = 0;
    }

    if (cctx->appliedParams.ldmParams.enableLdm)
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize);

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (U32)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize);
        if (ZSTD_isError(cSize)) return cSize;
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            if (cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne) {
                DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                    (U32)cctx->pledgedSrcSizePlusOne-1, (U32)cctx->consumedSrcSize);
                return ERROR(srcSize_wrong);
            }
        }
        return cSize + fhSize;
    }
}